

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

void duckdb::QuantileOperation::Destroy<duckdb::QuantileState<short,duckdb::QuantileStandardType>>
               (QuantileState<short,_duckdb::QuantileStandardType> *state,
               AggregateInputData *param_2)

{
  QuantileState<short,_duckdb::QuantileStandardType> *in_RSI;
  
  QuantileState<short,_duckdb::QuantileStandardType>::~QuantileState(in_RSI);
  return;
}

Assistant:

static void Destroy(STATE &state, AggregateInputData &) {
		state.~STATE();
	}